

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleTests.cpp
# Opt level: O2

void __thiscall
ParticleTest_GetSetPosition_Test<pica::Particle<(pica::Dimension)1>_>::
ParticleTest_GetSetPosition_Test
          (ParticleTest_GetSetPosition_Test<pica::Particle<(pica::Dimension)1>_> *this)

{
  ParticleTest<pica::Particle<(pica::Dimension)1>_>::ParticleTest
            (&this->super_ParticleTest<pica::Particle<(pica::Dimension)1>_>);
  (this->super_ParticleTest<pica::Particle<(pica::Dimension)1>_>).
  super_BaseParticleFixture<pica::Particle<(pica::Dimension)1>_>.super_BaseFixture.super_Test.
  _vptr_Test = (_func_int **)&PTR__Test_001f7770;
  return;
}

Assistant:

TYPED_TEST(ParticleTest, GetSetPosition)
{
    typedef typename ParticleTest<TypeParam>::Particle ParticleType;
    typedef typename ParticleTest<TypeParam>::PositionType PositionType;

    ParticleType particle = this->randomParticle();
    PositionType newPosition = this->getPosition(54.126, -431.35, 35.65);
    particle.setPosition(newPosition);
    ASSERT_EQ_VECTOR(newPosition, particle.getPosition(), this->dimension);
}